

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_create_info.cpp
# Opt level: O0

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
duckdb::CreateMacroInfo::Deserialize(Deserializer *deserializer)

{
  pointer pCVar1;
  Deserializer *in_RDI;
  unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true> result;
  vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
  extra_functions;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  pointer in_stack_ffffffffffffff28;
  vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
  *in_stack_ffffffffffffff30;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *this;
  char *in_stack_ffffffffffffff58;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> this_00;
  field_id_t in_stack_ffffffffffffff76;
  Deserializer *in_stack_ffffffffffffff78;
  field_id_t in_stack_ffffffffffffff86;
  Deserializer *in_stack_ffffffffffffff88;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> local_68 [2];
  vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
  *in_stack_ffffffffffffffa8;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
  *in_stack_ffffffffffffffb0;
  CatalogType in_stack_ffffffffffffffbf;
  CreateMacroInfo *in_stack_ffffffffffffffc0;
  string local_30 [48];
  
  this_00._M_head_impl = (CreateInfo *)in_RDI;
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff86,(char *)in_stack_ffffffffffffff78);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>>
            ((Deserializer *)this_00._M_head_impl,(field_id_t)((ulong)in_RDI >> 0x30),
             in_stack_ffffffffffffff58);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>,true>>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff76,(char *)this_00._M_head_impl);
  operator_new(0x198);
  Deserializer::Get<duckdb::CatalogType>((Deserializer *)0xacd75b);
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::unique_ptr
            ((unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *)
             in_stack_ffffffffffffff30,
             (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *)
             in_stack_ffffffffffffff28);
  vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
  ::vector(in_stack_ffffffffffffff30,
           (vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
            *)in_stack_ffffffffffffff28);
  CreateMacroInfo(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb0,
                  in_stack_ffffffffffffffa8);
  this = local_68;
  unique_ptr<duckdb::CreateMacroInfo,std::default_delete<duckdb::CreateMacroInfo>,true>::
  unique_ptr<std::default_delete<duckdb::CreateMacroInfo>,void>
            ((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
              *)this,in_stack_ffffffffffffff28);
  vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
  ::~vector((vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
             *)0xacd7cc);
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::~unique_ptr
            ((unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *)
             0xacd7d6);
  pCVar1 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)this);
  ::std::__cxx11::string::operator=((string *)&(pCVar1->super_CreateFunctionInfo).name,local_30);
  unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>::
  unique_ptr<duckdb::CreateMacroInfo,std::default_delete<std::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>>>,void>
            (this,(unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>_>
                   *)in_stack_ffffffffffffff28);
  unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
  ~unique_ptr((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
               *)0xacd819);
  vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
  ::~vector((vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
             *)0xacd823);
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::~unique_ptr
            ((unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *)
             0xacd830);
  ::std::__cxx11::string::~string(local_30);
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (_Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<CreateInfo> CreateMacroInfo::Deserialize(Deserializer &deserializer) {
	auto name = deserializer.ReadPropertyWithDefault<string>(200, "name");
	auto function = deserializer.ReadPropertyWithDefault<unique_ptr<MacroFunction>>(201, "function");
	auto extra_functions = deserializer.ReadPropertyWithDefault<vector<unique_ptr<MacroFunction>>>(202, "extra_functions");
	auto result = duckdb::unique_ptr<CreateMacroInfo>(new CreateMacroInfo(deserializer.Get<CatalogType>(), std::move(function), std::move(extra_functions)));
	result->name = std::move(name);
	return std::move(result);
}